

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.cpp
# Opt level: O3

void __thiscall EOPlus::Parser_Token_Server_Base::PutBack(Parser_Token_Server_Base *this,Token *t)

{
  double dVar1;
  undefined4 uVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  undefined3 uVar7;
  int iVar8;
  variant local_c0;
  undefined1 local_80 [24];
  _Alloc_hider local_68;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_58;
  bool local_48;
  bool bStack_47;
  bool bStack_46;
  bool bStack_45;
  bool bStack_44;
  undefined3 uStack_43;
  var_type local_40;
  int local_38;
  
  (this->reject_token).type = t->type;
  uVar2 = *(undefined4 *)&(t->data).field_0x4;
  dVar1 = (t->data).val_float;
  (this->reject_token).data.val_int = (t->data).val_int;
  *(undefined4 *)&(this->reject_token).data.field_0x4 = uVar2;
  (this->reject_token).data.val_float = dVar1;
  std::__cxx11::string::_M_assign((string *)&(this->reject_token).data.val_string);
  (this->reject_token).data.type = (t->data).type;
  bVar3 = (t->data).cache_val[0];
  bVar4 = (t->data).cache_val[1];
  bVar5 = (t->data).cache_val[2];
  bVar6 = (t->data).cache_val[3];
  uVar7 = *(undefined3 *)&(t->data).field_0x35;
  (this->reject_token).data.val_bool = (t->data).val_bool;
  (this->reject_token).data.cache_val[0] = bVar3;
  (this->reject_token).data.cache_val[1] = bVar4;
  (this->reject_token).data.cache_val[2] = bVar5;
  (this->reject_token).data.cache_val[3] = bVar6;
  *(undefined3 *)&(this->reject_token).data.field_0x35 = uVar7;
  (this->reject_token).newlines = t->newlines;
  this->reject_line = this->line;
  iVar8 = this->line - t->newlines;
  this->line = iVar8;
  if (t->type == NewLine) {
    this->line = iVar8 + -1;
  }
  iVar8 = t->newlines;
  t->newlines = iVar8 + -1;
  if (0 < iVar8) {
    do {
      util::variant::variant(&local_c0);
      local_80._0_4_ = NewLine;
      local_80._8_4_ = local_c0.val_int;
      local_80._12_4_ = local_c0._4_4_;
      local_80._16_4_ = local_c0.val_float._0_4_;
      local_80._20_4_ = local_c0.val_float._4_4_;
      local_68._M_p = (pointer)&local_58;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_68,local_c0.val_string._M_dataplus._M_p,
                 local_c0.val_string._M_dataplus._M_p + local_c0.val_string._M_string_length);
      local_40 = local_c0.type;
      local_48 = local_c0.val_bool;
      bStack_47 = local_c0.cache_val[0];
      bStack_46 = local_c0.cache_val[1];
      bStack_45 = local_c0.cache_val[2];
      bStack_44 = local_c0.cache_val[3];
      uStack_43 = local_c0._53_3_;
      local_38 = 0;
      std::deque<EOPlus::Token,_std::allocator<EOPlus::Token>_>::emplace_back<EOPlus::Token>
                (&(this->token_buffer).c,(Token *)local_80);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_68._M_p != &local_58) {
        operator_delete(local_68._M_p,local_58._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c0.val_string._M_dataplus._M_p != &local_c0.val_string.field_2) {
        operator_delete(local_c0.val_string._M_dataplus._M_p,
                        local_c0.val_string.field_2._M_allocated_capacity + 1);
      }
      iVar8 = t->newlines;
      t->newlines = iVar8 + -1;
    } while (0 < iVar8);
  }
  std::deque<EOPlus::Token,_std::allocator<EOPlus::Token>_>::push_back(&(this->token_buffer).c,t);
  return;
}

Assistant:

void Parser_Token_Server_Base::PutBack(Token t)
	{
		this->reject_token = t;
		this->reject_line = this->line;
		this->line -= t.newlines;

		if (t.type == Token::NewLine)
			--this->line;

		while (t.newlines-- > 0)
			this->token_buffer.push(Token(Token::NewLine));

		this->token_buffer.push(t);
	}